

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack18_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  
  auVar11._8_8_ = *(undefined8 *)(in + 2);
  auVar11._0_8_ = *(undefined8 *)(in + 2);
  uVar1 = in[1];
  auVar10 = *(undefined1 (*) [16])in;
  auVar18._8_4_ = 0x3ffff;
  auVar18._0_8_ = 0x3ffff0003ffff;
  auVar18._12_4_ = 0x3ffff;
  auVar19._16_4_ = 0x3ffff;
  auVar19._0_16_ = auVar18;
  auVar19._20_4_ = 0x3ffff;
  auVar19._24_4_ = 0x3ffff;
  auVar19._28_4_ = 0x3ffff;
  uVar2 = in[0xd];
  uVar5 = *(ulong *)(in + 4);
  *out = *in & 0x3ffff;
  auVar11 = vpshufd_avx(auVar11,0x50);
  auVar11 = vpsllvd_avx2(auVar11,_DAT_001ad900);
  auVar9 = vpshufd_avx(auVar10,0xa4);
  auVar12 = vpbroadcastd_avx512vl();
  uVar3 = in[8];
  auVar11 = vpblendd_avx2(auVar11,ZEXT416(uVar1 << 0xe),1);
  auVar11 = vpand_avx(auVar11,_DAT_001a07b0);
  auVar15 = vpsrld_avx(auVar10,0x1e);
  auVar11 = vpblendd_avx2(auVar11,auVar15,8);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar5;
  auVar15 = vpsllvd_avx2(auVar16,_DAT_001ad910);
  auVar6 = vpmovzxdq_avx2(auVar11);
  auVar7 = vpblendd_avx2(auVar6,auVar12,0x80);
  auVar10 = vpalignr_avx(auVar15,auVar10,8);
  auVar13._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar9;
  auVar13._16_16_ = ZEXT116(1) * auVar10;
  auVar6 = vpmovsxbd_avx2(ZEXT816(0x50303010100));
  auVar6 = vpermd_avx2(auVar6,auVar13);
  auVar12 = vpmovsxbd_avx2(ZEXT816(0xc1a08160412));
  auVar8._8_8_ = 0x300000003fffc;
  auVar8._0_8_ = 0x300000003fffc;
  auVar8._16_8_ = 0x300000003fffc;
  auVar8._24_8_ = 0x300000003fffc;
  auVar13 = vpandq_avx512vl(auVar13,auVar8);
  auVar8 = vpsrlvd_avx2(auVar6,auVar12);
  auVar6 = vpblendd_avx2(auVar8,auVar13,0xc0);
  auVar7 = vpor_avx2(auVar6,auVar7);
  auVar6 = vpand_avx2(auVar8,auVar19);
  auVar10 = vpmovsxbd_avx(ZEXT416(0x1000005));
  auVar6 = vpblendd_avx2(auVar7,auVar6,0x2a);
  *(undefined1 (*) [32])(out + 1) = auVar6;
  out[9] = (uint)(uVar5 >> 0x22) & 0x3ffff;
  uVar5 = *(ulong *)(in + 6);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar5;
  auVar11 = vpsllvd_avx2(auVar14,_DAT_001a27d0);
  auVar9._8_8_ = 0x3ff000003f000;
  auVar9._0_8_ = 0x3ff000003f000;
  auVar9 = vpandq_avx512vl(auVar11,auVar9);
  auVar10 = vpermi2d_avx512vl(auVar10,auVar14,auVar16);
  auVar15 = vpsrlvd_avx2(auVar10,_DAT_001a07e0);
  auVar11 = vpmovsxbd_avx(ZEXT416(0x1000004));
  auVar10 = vpmovzxdq_avx(auVar9);
  auVar9 = vpor_avx(auVar15,auVar10);
  auVar10 = vpand_avx(auVar15,auVar18);
  auVar10 = vpblendd_avx2(auVar9,auVar10,10);
  *(undefined1 (*) [16])(out + 10) = auVar10;
  out[0xe] = (uint)(uVar5 >> 0x3c) | (uVar3 & 0x3fff) << 4;
  uVar4 = in[9];
  out[0xf] = uVar3 >> 0xe;
  uVar3 = in[0xc];
  out[0x10] = uVar4 & 0x3ffff;
  uVar5 = *(ulong *)(in + 10);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar5;
  auVar10 = vpsllvd_avx2(auVar17,_DAT_001a3180);
  auVar15._8_8_ = 0x3fc000003c000;
  auVar15._0_8_ = 0x3fc000003c000;
  auVar10 = vpandq_avx512vl(auVar10,auVar15);
  auVar11 = vpermi2d_avx512vl(auVar11,auVar17,ZEXT416(uVar4));
  auVar9 = vpsrlvd_avx2(auVar11,auVar12._0_16_);
  auVar10 = vpmovzxdq_avx(auVar10);
  auVar11 = vpor_avx(auVar9,auVar10);
  auVar10 = vpand_avx(auVar9,auVar18);
  auVar10 = vpblendd_avx2(auVar11,auVar10,10);
  *(undefined1 (*) [16])(out + 0x11) = auVar10;
  out[0x15] = (uint)(uVar5 >> 0x3a) | (uVar3 & 0xfff) << 6;
  out[0x16] = uVar3 >> 0xc & 0x3ffff;
  out[0x17] = (uVar2 & 0xffff) << 2 | uVar3 >> 0x1e;
  return in + 0xe;
}

Assistant:

const uint32_t *__fastunpack18_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 2)) << (18 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 18);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 6)) << (18 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 18);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 10)) << (18 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 18);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 14)) << (18 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;

  return in + 1;
}